

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mmfwpicture.c
# Opt level: O1

MMFWPictureEntry * MMFWPictureEntry_New(MMFW *mmfw,int i)

{
  uint uVar1;
  uint32_t uVar2;
  MMFWPictureEntry *pMVar3;
  uint8_t *__ptr;
  int iVar4;
  uint uVar5;
  
  pMVar3 = (MMFWPictureEntry *)malloc(0x10);
  if (pMVar3 == (MMFWPictureEntry *)0x0) {
    pMVar3 = (MMFWPictureEntry *)0x0;
  }
  else {
    uVar1 = mmfw->offsets[i];
    uVar2 = mmfw->offsets[(long)i + 1];
    uVar5 = uVar2 - uVar1;
    pMVar3->length = uVar5;
    __ptr = (uint8_t *)malloc((ulong)uVar5);
    pMVar3->data = __ptr;
    fseek((FILE *)mmfw->fp,(ulong)uVar1,0);
    for (iVar4 = uVar2 - uVar1; iVar4 != 0; iVar4 = iVar4 + -1) {
      fread(__ptr,1,1,(FILE *)mmfw->fp);
      __ptr = __ptr + 1;
    }
  }
  return pMVar3;
}

Assistant:

MMFWPictureEntry *
MMFWPictureEntry_New(MMFW *mmfw, int i)
{
	MMFWPictureEntry *picture = malloc(sizeof(MMFWPictureEntry));

	if (!picture) {
		return NULL;
	}

	uint32_t offset = mmfw->offsets[i];
	uint32_t length = mmfw->offsets[i+1] - offset;

	picture->length = length;
	picture->data = malloc(picture->length);

	fseek(mmfw->fp, (long) offset, SEEK_SET);

	/* XXX one byte at a time :\ */
	uint8_t *datap = picture->data;
	for (int i = 0; i < picture->length; i++) {
		fread(datap, 1, 1, mmfw->fp);
		datap++;
	}

	return picture;
}